

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IColourImpl * Catch::anon_unknown_1::platformColourInstance(void)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar2;
  long *plVar3;
  undefined **ppuVar4;
  undefined1 *puVar5;
  ErrnoGuard guard;
  ErrnoGuard local_1c;
  
  ErrnoGuard::ErrnoGuard(&local_1c);
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_001cc980;
    IMutableContext::currentContext[1] = (long)&PTR__Context_001cc9d0;
  }
  plVar3 = (long *)(**(code **)(*IMutableContext::currentContext + 0x20))();
  plVar1 = (long *)*plVar3;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  if (plVar1 == (long *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (**(code **)(*plVar1 + 0x90))();
  }
  if (iVar2 == 0) {
    iVar2 = isatty(1);
    iVar2 = (iVar2 == 0) + 1;
  }
  if (iVar2 == 1) {
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance != '\0') {
      ppuVar4 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
      goto LAB_001671eb;
    }
    puVar5 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
    ppuVar4 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  }
  else {
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance != '\0') {
      ppuVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_001671eb;
    }
    puVar5 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
    ppuVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  if (iVar2 != 0) {
    __cxa_guard_release(puVar5);
  }
LAB_001671eb:
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  ErrnoGuard::~ErrnoGuard(&local_1c);
  return (IColourImpl *)ppuVar4;
}

Assistant:

IColourImpl* platformColourInstance() {
        ErrnoGuard guard;
        IConfigPtr config = getCurrentContext().getConfig();
        UseColour::YesOrNo colourMode = config
            ? config->useColour()
            : UseColour::Auto;
        if( colourMode == UseColour::Auto )
            colourMode = useColourOnPlatform()
                ? UseColour::Yes
                : UseColour::No;
        return colourMode == UseColour::Yes
            ? PosixColourImpl::instance()
            : NoColourImpl::instance();
    }